

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

Vec_Ptr_t *
findNextLevelDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesInstance,
          antecedentConsequentVectorsStruct *anteConsecInstance,Vec_Ptr_t *previousMonotoneVectors)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *p;
  antecedentConsequentVectorsStruct *anteConseVectors;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *p_00;
  void **ppvVar8;
  long lVar9;
  int iVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  ulong local_90;
  
  pVVar5 = (Vec_Ptr_t *)calloc(1,0x10);
  p = (Vec_Int_t *)calloc(1,0x10);
  iVar10 = previousMonotoneVectors->nSize;
  if (0 < iVar10) {
    lVar9 = 0;
    do {
      pvVar3 = previousMonotoneVectors->pArray[lVar9];
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar13 = 0;
        do {
          Vec_IntPushUniqueLocal(p,*(int *)(*(long *)((long)pvVar3 + 8) + lVar13 * 4));
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)pvVar3 + 4));
        iVar10 = previousMonotoneVectors->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar10);
    if (0 < iVar10) {
      local_90 = 0;
      iVar10 = 0;
      lVar9 = 0;
      do {
        pvVar3 = previousMonotoneVectors->pArray[lVar9];
        anteConseVectors = (antecedentConsequentVectorsStruct *)calloc(1,0x10);
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        iVar1 = *(int *)((long)pvVar3 + 4);
        pVVar6->nSize = iVar1;
        pVVar6->nCap = iVar1;
        if ((long)iVar1 == 0) {
          sVar11 = 0;
          piVar7 = (int *)0x0;
        }
        else {
          sVar11 = (long)iVar1 << 2;
          piVar7 = (int *)malloc(sVar11);
        }
        pVVar6->pArray = piVar7;
        memcpy(piVar7,*(void **)((long)pvVar3 + 8),sVar11);
        anteConseVectors->attrAntecedents = pVVar6;
        pVVar6 = vectorDifference(anteConsecInstance->attrConsequentCandidates,p);
        anteConseVectors->attrConsequentCandidates = pVVar6;
        if (pVVar6 == (Vec_Int_t *)0x0) {
          __assert_fail("vDiffVector",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                        ,0x1db,
                        "Vec_Ptr_t *findNextLevelDisjunctiveMonotone(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, Vec_Ptr_t *)"
                       );
        }
        pVVar6 = findNewDisjunctiveMonotone(pAig,aigPoIndicesInstance,anteConseVectors);
        if (pVVar6 != (Vec_Int_t *)0x0) {
          iVar1 = pVVar6->nSize;
          if (0 < (long)iVar1) {
            lVar13 = (long)iVar10;
            lVar12 = 0;
            do {
              iVar4 = pVVar6->pArray[lVar12];
              p_00 = (Vec_Int_t *)malloc(0x10);
              iVar2 = *(int *)((long)pvVar3 + 4);
              p_00->nSize = iVar2;
              p_00->nCap = iVar2;
              if ((long)iVar2 == 0) {
                sVar11 = 0;
                piVar7 = (int *)0x0;
              }
              else {
                sVar11 = (long)iVar2 << 2;
                piVar7 = (int *)malloc(sVar11);
              }
              p_00->pArray = piVar7;
              memcpy(piVar7,*(void **)((long)pvVar3 + 8),sVar11);
              Vec_IntPush(p_00,iVar4);
              iVar4 = (int)local_90;
              if (iVar10 == iVar4) {
                if (iVar4 < 0x10) {
                  if (pVVar5->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar5->pArray,0x80);
                  }
                  pVVar5->pArray = ppvVar8;
                  pVVar5->nCap = 0x10;
                  local_90 = 0x10;
                }
                else {
                  local_90 = (ulong)(uint)(iVar4 * 2);
                  if (pVVar5->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(local_90 * 8);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar5->pArray,local_90 * 8);
                  }
                  pVVar5->pArray = ppvVar8;
                  pVVar5->nCap = iVar4 * 2;
                }
              }
              else {
                ppvVar8 = pVVar5->pArray;
              }
              iVar10 = iVar10 + 1;
              pVVar5->nSize = iVar10;
              ppvVar8[lVar13 + lVar12] = p_00;
              lVar12 = lVar12 + 1;
            } while (iVar1 != lVar12);
          }
          if (pVVar6->pArray != (int *)0x0) {
            free(pVVar6->pArray);
          }
          free(pVVar6);
        }
        deallocAntecedentConsequentVectorsStruct(anteConseVectors);
        lVar9 = lVar9 + 1;
      } while (lVar9 < previousMonotoneVectors->nSize);
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
    }
  }
  free(p);
  return pVVar5;
}

Assistant:

Vec_Ptr_t *findNextLevelDisjunctiveMonotone( 
		Aig_Man_t *pAig, 
		struct aigPoIndices *aigPoIndicesInstance, 
		struct antecedentConsequentVectorsStruct *anteConsecInstance, 
		Vec_Ptr_t *previousMonotoneVectors )
{
	Vec_Ptr_t *newLevelPtrVec;
	Vec_Int_t *vElem, *vNewDisjunctVector, *newDisjunction;
	int i, j, iElem;
	struct antecedentConsequentVectorsStruct *anteConsecInstanceLocal;
	Vec_Int_t *vUnionPrevMonotoneVector, *vDiffVector;

	newLevelPtrVec = Vec_PtrAlloc(0);
	vUnionPrevMonotoneVector = Vec_IntAlloc(0);
	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
		Vec_IntForEachEntry( vElem, iElem, j )
			Vec_IntPushUniqueLocal( vUnionPrevMonotoneVector, iElem );

	Vec_PtrForEachEntry(Vec_Int_t *, previousMonotoneVectors, vElem, i)
	{
		anteConsecInstanceLocal = allocAntecedentConsequentVectorsStruct();

		anteConsecInstanceLocal->attrAntecedents = Vec_IntDup(vElem);	
		vDiffVector = vectorDifference( anteConsecInstance->attrConsequentCandidates, vUnionPrevMonotoneVector);
		anteConsecInstanceLocal->attrConsequentCandidates = vDiffVector;
		assert( vDiffVector );

		//printf("Calling target function %d\n", i);
		vNewDisjunctVector = findNewDisjunctiveMonotone( pAig, aigPoIndicesInstance, anteConsecInstanceLocal );

		if( vNewDisjunctVector )
		{
			Vec_IntForEachEntry(vNewDisjunctVector, iElem, j)
			{
				newDisjunction = Vec_IntDup(vElem);
				Vec_IntPush( newDisjunction, iElem );
				Vec_PtrPush( newLevelPtrVec, newDisjunction );
			}
			Vec_IntFree(vNewDisjunctVector);
		}
		deallocAntecedentConsequentVectorsStruct( anteConsecInstanceLocal );
	}

	Vec_IntFree(vUnionPrevMonotoneVector);

	return newLevelPtrVec;
}